

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.h
# Opt level: O2

void gutil::runParallel(ParallelFunction *fct,long start,long end,long step)

{
  uint uVar1;
  uint uVar2;
  ulong *puVar3;
  Thread *this;
  long lVar4;
  Thread *pTVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar1 = gutil::Thread::getMaxThreads();
  uVar2 = (uint)(((end - start) + step) / step);
  if ((int)uVar1 < (int)uVar2) {
    uVar2 = uVar1;
  }
  if ((int)uVar2 < 2) {
    (**fct->_vptr_ParallelFunction)(fct,start,end,step);
    return;
  }
  uVar7 = (ulong)uVar2;
  puVar3 = (ulong *)operator_new__(uVar7 * 8 + 8);
  *puVar3 = uVar7;
  pTVar5 = (Thread *)(puVar3 + 1);
  lVar4 = 0;
  this = pTVar5;
  do {
    gutil::Thread::Thread(this);
    lVar4 = lVar4 + -8;
    this = this + 8;
  } while (-lVar4 != uVar7 * 8);
  uVar6 = uVar7;
  while (bVar8 = uVar6 != 0, uVar6 = uVar6 - 1, bVar8) {
    gutil::Thread::create((ParallelFunction *)pTVar5,(long)fct,start,end,uVar2 * (int)step);
    start = start + step;
    pTVar5 = pTVar5 + 8;
  }
  while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
    gutil::Thread::join();
  }
  if (*puVar3 != 0) {
    lVar4 = *puVar3 << 3;
    do {
      gutil::Thread::~Thread((Thread *)((long)puVar3 + lVar4));
      lVar4 = lVar4 + -8;
    } while (lVar4 != 0);
  }
  operator_delete__(puVar3);
  return;
}

Assistant:

inline void runParallel(ParallelFunction &fct, long start, long end, long step)
{
  int n=Thread::getMaxThreads();
  n=std::min(n, static_cast<int>((end-start+1+step-1)/step));

  if (n > 1)
  {
    Thread *thread=new Thread [n];

    for (int i=0; i<n; i++)
    {
      thread[i].create(fct, start+i*step, end, n*step, -1);
    }

    for (int i=0; i<n; i++)
    {
      thread[i].join();
    }

    delete [] thread;
  }
  else
  {
    fct.run(start, end, step);
  }
}